

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_stats_table_scan_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  long lVar3;
  undefined1 auVar4 [16];
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined1 auVar12 [16];
  uint uVar13;
  uint uVar14;
  parasail_result_t *ppVar15;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *b_06;
  __m128i *__dest;
  __m128i *__dest_00;
  __m128i *__dest_01;
  __m128i *__dest_02;
  __m128i *ptr;
  __m128i *ptr_00;
  size_t __n;
  ulong uVar16;
  int iVar17;
  __m128i *len;
  long lVar18;
  long lVar19;
  uint uVar20;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  undefined8 unaff_RBX;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  short sVar32;
  undefined4 uVar34;
  short sVar46;
  short sVar48;
  short sVar50;
  short sVar52;
  short sVar54;
  undefined1 auVar36 [16];
  undefined4 uVar35;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 auVar39 [16];
  short sVar44;
  short sVar56;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ushort uVar65;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ulong uVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  short sVar84;
  ushort uVar85;
  short sVar87;
  ushort uVar88;
  short sVar89;
  ushort uVar90;
  short sVar91;
  ushort uVar92;
  short sVar93;
  ushort uVar94;
  short sVar95;
  ushort uVar96;
  short sVar97;
  ushort uVar98;
  undefined1 auVar86 [16];
  short sVar99;
  ushort uVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  ushort uVar106;
  ushort uVar107;
  ushort uVar108;
  ushort uVar109;
  ushort uVar110;
  ushort uVar111;
  ushort uVar112;
  ushort uVar113;
  ushort uVar114;
  ushort uVar115;
  ushort uVar116;
  ushort uVar117;
  ushort uVar118;
  ushort uVar119;
  ushort uVar120;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i c_06;
  uint local_2bc;
  int local_274;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  long local_1d0;
  ushort local_1c8;
  ushort uStack_1c6;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  short local_a8;
  short sStack_a6;
  undefined1 local_98 [16];
  short sVar33;
  short sVar45;
  short sVar47;
  short sVar49;
  short sVar51;
  short sVar53;
  short sVar55;
  short sVar57;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_scan_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar5 = (profile->profile16).score;
    if (pvVar5 == (void *)0x0) {
      parasail_sw_stats_table_scan_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_scan_profile_sse41_128_16_cold_6();
      }
      else {
        uVar26 = profile->s1Len;
        uVar21 = (ulong)uVar26;
        if ((int)uVar26 < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_table_scan_profile_sse41_128_16_cold_1();
        }
        else {
          uVar25 = uVar21 + 7;
          pvVar7 = (profile->profile16).matches;
          pvVar8 = (profile->profile16).similar;
          iVar17 = ppVar6->min;
          iVar22 = -iVar17;
          if (iVar17 != -open && SBORROW4(iVar17,-open) == iVar17 + open < 0) {
            iVar22 = open;
          }
          iVar17 = ppVar6->max;
          ppVar15 = parasail_result_new_table3((uint)uVar25 & 0x7ffffff8,s2Len);
          if (ppVar15 != (parasail_result_t *)0x0) {
            uVar28 = uVar25 >> 3;
            ppVar15->flag = ppVar15->flag | 0x8230404;
            b = parasail_memalign___m128i(0x10,uVar28);
            b_00 = parasail_memalign___m128i(0x10,uVar28);
            b_01 = parasail_memalign___m128i(0x10,uVar28);
            b_02 = parasail_memalign___m128i(0x10,uVar28);
            b_03 = parasail_memalign___m128i(0x10,uVar28);
            b_04 = parasail_memalign___m128i(0x10,uVar28);
            b_05 = parasail_memalign___m128i(0x10,uVar28);
            b_06 = parasail_memalign___m128i(0x10,uVar28);
            __dest = parasail_memalign___m128i(0x10,uVar28);
            __dest_00 = parasail_memalign___m128i(0x10,uVar28);
            __dest_01 = parasail_memalign___m128i(0x10,uVar28);
            __dest_02 = parasail_memalign___m128i(0x10,uVar28);
            ptr = parasail_memalign___m128i(0x10,uVar28);
            ptr_00 = parasail_memalign___m128i(0x10,uVar28);
            if (b == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_03 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_04 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_05 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (b_06 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar36 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar34 = auVar36._0_4_;
            auVar36 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar35 = auVar36._0_4_;
            local_2bc = iVar22 - 0x7fff;
            auVar37 = pshuflw(ZEXT416(local_2bc),ZEXT416(local_2bc),0);
            local_1c8 = auVar37._0_2_;
            uStack_1c6 = auVar37._2_2_;
            auVar36 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar17
                                            ));
            auVar38 = pshuflw(auVar36,auVar36,0);
            local_a8 = auVar38._0_2_;
            sStack_a6 = auVar38._2_2_;
            uVar27 = (uint)uVar28;
            auVar58 = pshufb(ZEXT416(uVar27),_DAT_008d2ad0);
            uVar13 = local_2bc & 0xffff;
            auVar36 = pshufb(ZEXT416(-(gap * uVar27)),_DAT_008d2ad0);
            auVar66 = paddsw(auVar36,ZEXT416(uVar13));
            c[1] = (longlong)b_04;
            c[0] = uVar28;
            len = b_01;
            parasail_memset___m128i(b_03,c,(size_t)b_01);
            c_00[1] = extraout_RDX;
            c_00[0] = uVar28;
            parasail_memset___m128i(b_04,c_00,(size_t)len);
            c_01[1] = extraout_RDX_00;
            c_01[0] = uVar28;
            parasail_memset___m128i(b_05,c_01,(size_t)len);
            c_02[1] = extraout_RDX_01;
            c_02[0] = uVar28;
            parasail_memset___m128i(b_06,c_02,(size_t)len);
            c_03[1] = extraout_RDX_02;
            c_03[0] = uVar28;
            parasail_memset___m128i(b,c_03,(size_t)len);
            c_04[1] = extraout_RDX_03;
            c_04[0] = uVar28;
            parasail_memset___m128i(b_00,c_04,(size_t)len);
            c_05[1] = extraout_RDX_04;
            c_05[0] = uVar28;
            parasail_memset___m128i(b_01,c_05,(size_t)len);
            c_06[1] = extraout_RDX_05;
            c_06[0] = uVar28;
            parasail_memset___m128i(b_02,c_06,(size_t)len);
            auVar36._4_4_ = uVar35;
            auVar36._0_4_ = uVar35;
            auVar36._8_4_ = uVar35;
            auVar36._12_4_ = uVar35;
            auVar59._4_4_ = uVar34;
            auVar59._0_4_ = uVar34;
            auVar59._8_4_ = uVar34;
            auVar59._12_4_ = uVar34;
            uVar14 = uVar27 - 1;
            auVar70 = psubsw((undefined1  [16])0x0,auVar59);
            lVar18 = (ulong)uVar14 << 4;
            auVar39 = pmovsxbw(extraout_XMM0,0x101010101010101);
            uVar16 = uVar28;
            auVar59 = auVar39;
            do {
              *(undefined1 (*) [16])((long)*ptr + lVar18) = auVar70;
              *(undefined1 (*) [16])((long)*ptr_00 + lVar18) = auVar59;
              auVar70 = psubsw(auVar70,auVar36);
              auVar59 = paddsw(auVar59,auVar39);
              lVar18 = lVar18 + -0x10;
              iVar17 = (int)uVar16;
              uVar20 = iVar17 - 1;
              uVar16 = (ulong)uVar20;
            } while (uVar20 != 0 && 0 < iVar17);
            __n = uVar28 << 4;
            uVar16 = 1;
            if (1 < s2Len) {
              uVar16 = (ulong)(uint)s2Len;
            }
            lVar29 = (ulong)(uVar27 + (uVar27 == 0)) << 4;
            lVar30 = uVar28 * (uint)s2Len;
            lVar18 = lVar30 * 4;
            lVar3 = lVar30 * 8;
            lVar9 = lVar30 * 0xc;
            lVar11 = lVar30 * 0x1c;
            lVar31 = lVar30 * 0x10;
            lVar10 = lVar30 * 0x14;
            lVar30 = lVar30 * 0x18;
            auVar39._4_2_ = local_1c8;
            auVar39._0_4_ = auVar37._0_4_;
            auVar39._6_2_ = uStack_1c6;
            auVar39._8_2_ = local_1c8;
            auVar39._10_2_ = uStack_1c6;
            auVar39._12_2_ = local_1c8;
            auVar39._14_2_ = uStack_1c6;
            local_248 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar38._0_4_));
            uStack_240 = CONCAT26(sStack_a6,CONCAT24(local_a8,auVar38._0_4_));
            local_1d0 = 0;
            uVar28 = 0;
            local_274 = 0;
            auVar37 = auVar39;
            local_98 = auVar39;
            do {
              lVar19 = (long)(int)(ppVar6->mapper[(byte)s2[uVar28]] * uVar27) * 0x10;
              uVar69 = b_06[uVar14][0];
              auVar79._0_8_ = uVar69 << 0x10;
              auVar79._8_8_ = b_06[uVar14][1] << 0x10 | uVar69 >> 0x30;
              uVar69 = b_05[uVar14][0];
              auVar38._0_8_ = uVar69 << 0x10;
              auVar38._8_8_ = b_05[uVar14][1] << 0x10 | uVar69 >> 0x30;
              uVar69 = b_04[uVar14][0];
              auVar70._0_8_ = uVar69 << 0x10;
              auVar70._8_8_ = b_04[uVar14][1] << 0x10 | uVar69 >> 0x30;
              uVar69 = b_03[uVar14][0];
              auVar76._0_8_ = uVar69 << 0x10;
              auVar76._8_8_ = b_03[uVar14][1] << 0x10 | uVar69 >> 0x30;
              lVar24 = 0;
              auVar36 = ZEXT816(0);
              local_208 = (undefined1  [16])0x0;
              local_218 = (undefined1  [16])0x0;
              auVar60 = (undefined1  [16])0x0;
              uVar106 = local_1c8;
              uVar107 = uStack_1c6;
              uVar109 = local_1c8;
              uVar111 = uStack_1c6;
              uVar113 = local_1c8;
              uVar115 = uStack_1c6;
              uVar117 = local_1c8;
              uVar119 = uStack_1c6;
              do {
                auVar59 = *(undefined1 (*) [16])((long)*b_03 + lVar24);
                auVar41 = *(undefined1 (*) [16])((long)*b_04 + lVar24);
                auVar4._4_4_ = uVar34;
                auVar4._0_4_ = uVar34;
                auVar4._8_4_ = uVar34;
                auVar4._12_4_ = uVar34;
                auVar101 = psubsw(auVar59,auVar4);
                auVar86._4_4_ = uVar35;
                auVar86._0_4_ = uVar35;
                auVar86._8_4_ = uVar35;
                auVar86._12_4_ = uVar35;
                auVar86 = psubsw(*(undefined1 (*) [16])((long)*b + lVar24),auVar86);
                sVar32 = auVar101._0_2_;
                sVar84 = auVar86._0_2_;
                auVar83._0_2_ = -(ushort)(sVar84 < sVar32);
                sVar44 = auVar101._2_2_;
                sVar87 = auVar86._2_2_;
                auVar83._2_2_ = -(ushort)(sVar87 < sVar44);
                sVar46 = auVar101._4_2_;
                sVar89 = auVar86._4_2_;
                auVar83._4_2_ = -(ushort)(sVar89 < sVar46);
                sVar48 = auVar101._6_2_;
                sVar91 = auVar86._6_2_;
                auVar83._6_2_ = -(ushort)(sVar91 < sVar48);
                sVar50 = auVar101._8_2_;
                sVar93 = auVar86._8_2_;
                auVar83._8_2_ = -(ushort)(sVar93 < sVar50);
                sVar52 = auVar101._10_2_;
                sVar95 = auVar86._10_2_;
                auVar83._10_2_ = -(ushort)(sVar95 < sVar52);
                sVar54 = auVar101._12_2_;
                sVar97 = auVar86._12_2_;
                sVar56 = auVar101._14_2_;
                auVar83._12_2_ = -(ushort)(sVar97 < sVar54);
                sVar99 = auVar86._14_2_;
                auVar83._14_2_ = -(ushort)(sVar99 < sVar56);
                auVar105 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar24),auVar41,auVar83);
                auVar86 = *(undefined1 (*) [16])((long)*b_05 + lVar24);
                auVar67 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar24),auVar86,auVar83);
                auVar4 = *(undefined1 (*) [16])((long)*b_06 + lVar24);
                auVar83 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar24),auVar4,auVar83);
                auVar60 = paddsw(auVar60,*(undefined1 (*) [16])((long)*ptr + lVar24));
                sVar33 = auVar60._0_2_;
                auVar40._0_2_ = -(ushort)((short)uVar106 < sVar33);
                sVar45 = auVar60._2_2_;
                auVar40._2_2_ = -(ushort)((short)uVar107 < sVar45);
                sVar47 = auVar60._4_2_;
                auVar40._4_2_ = -(ushort)((short)uVar109 < sVar47);
                sVar49 = auVar60._6_2_;
                auVar40._6_2_ = -(ushort)((short)uVar111 < sVar49);
                sVar51 = auVar60._8_2_;
                auVar40._8_2_ = -(ushort)((short)uVar113 < sVar51);
                sVar53 = auVar60._10_2_;
                auVar40._10_2_ = -(ushort)((short)uVar115 < sVar53);
                sVar55 = auVar60._12_2_;
                sVar57 = auVar60._14_2_;
                auVar40._12_2_ = -(ushort)((short)uVar117 < sVar55);
                auVar40._14_2_ = -(ushort)((short)uVar119 < sVar57);
                local_218 = pblendvb(local_218,local_178,auVar40);
                local_208 = pblendvb(local_208,local_168,auVar40);
                uVar85 = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
                uVar88 = (ushort)(sVar87 < sVar44) * sVar44 | (ushort)(sVar87 >= sVar44) * sVar87;
                uVar90 = (ushort)(sVar89 < sVar46) * sVar46 | (ushort)(sVar89 >= sVar46) * sVar89;
                uVar92 = (ushort)(sVar91 < sVar48) * sVar48 | (ushort)(sVar91 >= sVar48) * sVar91;
                uVar94 = (ushort)(sVar93 < sVar50) * sVar50 | (ushort)(sVar93 >= sVar50) * sVar93;
                uVar96 = (ushort)(sVar95 < sVar52) * sVar52 | (ushort)(sVar95 >= sVar52) * sVar95;
                uVar98 = (ushort)(sVar97 < sVar54) * sVar54 | (ushort)(sVar97 >= sVar54) * sVar97;
                uVar100 = (ushort)(sVar99 < sVar56) * sVar56 | (ushort)(sVar99 >= sVar56) * sVar99;
                auVar102 = pmovsxbw(auVar101,0x101010101010101);
                uVar106 = (sVar33 < (short)uVar106) * uVar106 |
                          (ushort)(sVar33 >= (short)uVar106) * sVar33;
                uVar107 = (sVar45 < (short)uVar107) * uVar107 |
                          (ushort)(sVar45 >= (short)uVar107) * sVar45;
                uVar109 = (sVar47 < (short)uVar109) * uVar109 |
                          (ushort)(sVar47 >= (short)uVar109) * sVar47;
                uVar111 = (sVar49 < (short)uVar111) * uVar111 |
                          (ushort)(sVar49 >= (short)uVar111) * sVar49;
                uVar113 = (sVar51 < (short)uVar113) * uVar113 |
                          (ushort)(sVar51 >= (short)uVar113) * sVar51;
                uVar115 = (sVar53 < (short)uVar115) * uVar115 |
                          (ushort)(sVar53 >= (short)uVar115) * sVar53;
                uVar117 = (sVar55 < (short)uVar117) * uVar117 |
                          (ushort)(sVar55 >= (short)uVar117) * sVar55;
                uVar119 = (sVar57 < (short)uVar119) * uVar119 |
                          (ushort)(sVar57 >= (short)uVar119) * sVar57;
                auVar60 = paddsw(local_158,*(undefined1 (*) [16])((long)*ptr_00 + lVar24));
                auVar36 = pblendvb(auVar36,auVar60,auVar40);
                auVar76 = paddsw(auVar76,*(undefined1 (*) [16])((long)pvVar5 + lVar24 + lVar19));
                auVar70 = paddsw(auVar70,*(undefined1 (*) [16])((long)pvVar7 + lVar24 + lVar19));
                auVar38 = paddsw(auVar38,*(undefined1 (*) [16])((long)pvVar8 + lVar24 + lVar19));
                sVar32 = auVar76._0_2_;
                auVar101._0_2_ = -(ushort)(sVar32 < (short)uVar85);
                sVar33 = auVar76._2_2_;
                auVar101._2_2_ = -(ushort)(sVar33 < (short)uVar88);
                sVar44 = auVar76._4_2_;
                auVar101._4_2_ = -(ushort)(sVar44 < (short)uVar90);
                sVar45 = auVar76._6_2_;
                auVar101._6_2_ = -(ushort)(sVar45 < (short)uVar92);
                sVar46 = auVar76._8_2_;
                auVar101._8_2_ = -(ushort)(sVar46 < (short)uVar94);
                sVar47 = auVar76._10_2_;
                auVar101._10_2_ = -(ushort)(sVar47 < (short)uVar96);
                sVar48 = auVar76._12_2_;
                auVar101._12_2_ = -(ushort)(sVar48 < (short)uVar98);
                sVar49 = auVar76._14_2_;
                auVar101._14_2_ = -(ushort)(sVar49 < (short)uVar100);
                local_178 = pblendvb(auVar70,auVar105,auVar101);
                local_168 = pblendvb(auVar38,auVar67,auVar101);
                auVar60 = paddsw(auVar83,auVar102);
                auVar79 = paddsw(auVar79,auVar102);
                local_158 = pblendvb(auVar79,auVar60,auVar101);
                puVar1 = (ushort *)((long)*b + lVar24);
                *puVar1 = uVar85;
                puVar1[1] = uVar88;
                puVar1[2] = uVar90;
                puVar1[3] = uVar92;
                puVar1[4] = uVar94;
                puVar1[5] = uVar96;
                puVar1[6] = uVar98;
                puVar1[7] = uVar100;
                *(undefined1 (*) [16])((long)*b_00 + lVar24) = auVar105;
                *(undefined1 (*) [16])((long)*b_01 + lVar24) = auVar67;
                *(undefined1 (*) [16])((long)*b_02 + lVar24) = auVar60;
                uVar85 = (ushort)((short)uVar85 < sVar32) * sVar32 |
                         ((short)uVar85 >= sVar32) * uVar85;
                uVar88 = (ushort)((short)uVar88 < sVar33) * sVar33 |
                         ((short)uVar88 >= sVar33) * uVar88;
                uVar90 = (ushort)((short)uVar90 < sVar44) * sVar44 |
                         ((short)uVar90 >= sVar44) * uVar90;
                uVar92 = (ushort)((short)uVar92 < sVar45) * sVar45 |
                         ((short)uVar92 >= sVar45) * uVar92;
                auVar60._0_8_ = CONCAT26(uVar92,CONCAT24(uVar90,CONCAT22(uVar88,uVar85)));
                auVar60._8_2_ =
                     (ushort)((short)uVar94 < sVar46) * sVar46 | ((short)uVar94 >= sVar46) * uVar94;
                auVar60._10_2_ =
                     (ushort)((short)uVar96 < sVar47) * sVar47 | ((short)uVar96 >= sVar47) * uVar96;
                auVar60._12_2_ =
                     (ushort)((short)uVar98 < sVar48) * sVar48 | ((short)uVar98 >= sVar48) * uVar98;
                auVar60._14_2_ =
                     (ushort)((short)uVar100 < sVar49) * sVar49 |
                     ((short)uVar100 >= sVar49) * uVar100;
                *(undefined1 (*) [16])((long)*b_03 + lVar24) = auVar76;
                *(undefined1 (*) [16])((long)*b_04 + lVar24) = auVar70;
                *(undefined1 (*) [16])((long)*b_05 + lVar24) = auVar38;
                *(undefined1 (*) [16])((long)*b_06 + lVar24) = auVar79;
                lVar24 = lVar24 + 0x10;
                auVar38 = auVar86;
                auVar70 = auVar41;
                auVar76 = auVar59;
                auVar79 = auVar4;
              } while (lVar29 != lVar24);
              lVar19 = local_178._8_8_;
              uVar69 = local_178._0_8_;
              local_178._0_8_ = uVar69 << 0x10;
              local_178._8_8_ = lVar19 << 0x10 | uVar69 >> 0x30;
              lVar19 = local_168._8_8_;
              uVar69 = local_168._0_8_;
              local_168._0_8_ = uVar69 << 0x10;
              local_168._8_8_ = lVar19 << 0x10 | uVar69 >> 0x30;
              lVar19 = local_158._8_8_;
              uVar69 = local_158._0_8_;
              local_158._0_8_ = uVar69 << 0x10;
              local_158._8_8_ = lVar19 << 0x10 | uVar69 >> 0x30;
              auVar67._0_8_ = auVar60._0_8_ << 0x10;
              auVar67._8_8_ = auVar60._8_8_ << 0x10 | (ulong)uVar92;
              auVar59 = paddsw((undefined1  [16])*ptr,auVar67);
              sVar32 = auVar59._0_2_;
              auVar41._0_2_ = -(ushort)(sVar32 < (short)uVar106);
              sVar33 = auVar59._2_2_;
              auVar41._2_2_ = -(ushort)(sVar33 < (short)uVar107);
              sVar44 = auVar59._4_2_;
              auVar41._4_2_ = -(ushort)(sVar44 < (short)uVar109);
              sVar45 = auVar59._6_2_;
              auVar41._6_2_ = -(ushort)(sVar45 < (short)uVar111);
              sVar46 = auVar59._8_2_;
              auVar41._8_2_ = -(ushort)(sVar46 < (short)uVar113);
              sVar47 = auVar59._10_2_;
              auVar41._10_2_ = -(ushort)(sVar47 < (short)uVar115);
              sVar48 = auVar59._12_2_;
              auVar41._12_2_ = -(ushort)(sVar48 < (short)uVar117);
              sVar49 = auVar59._14_2_;
              auVar41._14_2_ = -(ushort)(sVar49 < (short)uVar119);
              auVar102._0_2_ =
                   (sVar32 < (short)uVar106) * uVar106 | (ushort)(sVar32 >= (short)uVar106) * sVar32
              ;
              auVar102._2_2_ =
                   (sVar33 < (short)uVar107) * uVar107 | (ushort)(sVar33 >= (short)uVar107) * sVar33
              ;
              auVar102._4_2_ =
                   (sVar44 < (short)uVar109) * uVar109 | (ushort)(sVar44 >= (short)uVar109) * sVar44
              ;
              auVar102._6_2_ =
                   (sVar45 < (short)uVar111) * uVar111 | (ushort)(sVar45 >= (short)uVar111) * sVar45
              ;
              auVar102._8_2_ =
                   (sVar46 < (short)uVar113) * uVar113 | (ushort)(sVar46 >= (short)uVar113) * sVar46
              ;
              auVar102._10_2_ =
                   (sVar47 < (short)uVar115) * uVar115 | (ushort)(sVar47 >= (short)uVar115) * sVar47
              ;
              auVar102._12_2_ =
                   (sVar48 < (short)uVar117) * uVar117 | (ushort)(sVar48 >= (short)uVar117) * sVar48
              ;
              auVar102._14_2_ =
                   (sVar49 < (short)uVar119) * uVar119 | (ushort)(sVar49 >= (short)uVar119) * sVar49
              ;
              auVar70 = pblendvb(local_178,local_218,auVar41);
              auVar38 = pblendvb(local_168,local_208,auVar41);
              auVar59 = paddsw((undefined1  [16])*ptr_00,local_158);
              auVar36 = pblendvb(auVar59,auVar36,auVar41);
              iVar17 = 6;
              do {
                auVar103._0_8_ = auVar70._0_8_ << 0x10;
                auVar103._8_8_ = auVar70._8_8_ << 0x10 | auVar70._0_8_ >> 0x30;
                auVar80._0_8_ = auVar102._0_8_ << 0x10;
                auVar80._8_8_ = auVar102._8_8_ << 0x10 | auVar102._0_8_ >> 0x30;
                auVar59 = paddsw(auVar80,auVar66);
                sVar32 = auVar102._0_2_;
                sVar50 = auVar59._0_2_;
                auVar105._0_2_ = -(ushort)(sVar50 < sVar32);
                sVar33 = auVar102._2_2_;
                sVar51 = auVar59._2_2_;
                auVar105._2_2_ = -(ushort)(sVar51 < sVar33);
                sVar44 = auVar102._4_2_;
                sVar52 = auVar59._4_2_;
                auVar105._4_2_ = -(ushort)(sVar52 < sVar44);
                sVar45 = auVar102._6_2_;
                sVar53 = auVar59._6_2_;
                auVar105._6_2_ = -(ushort)(sVar53 < sVar45);
                sVar46 = auVar102._8_2_;
                sVar54 = auVar59._8_2_;
                auVar105._8_2_ = -(ushort)(sVar54 < sVar46);
                sVar47 = auVar102._10_2_;
                sVar55 = auVar59._10_2_;
                auVar105._10_2_ = -(ushort)(sVar55 < sVar47);
                sVar48 = auVar102._12_2_;
                sVar56 = auVar59._12_2_;
                sVar49 = auVar102._14_2_;
                auVar105._12_2_ = -(ushort)(sVar56 < sVar48);
                sVar57 = auVar59._14_2_;
                auVar105._14_2_ = -(ushort)(sVar57 < sVar49);
                auVar70 = pblendvb(auVar103,auVar70,auVar105);
                auVar77._0_8_ = auVar38._0_8_ << 0x10;
                auVar77._8_8_ = auVar38._8_8_ << 0x10 | auVar38._0_8_ >> 0x30;
                auVar73._0_8_ = auVar36._0_8_ << 0x10;
                auVar73._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
                auVar59 = paddsw(auVar73,auVar58);
                uVar106 = (ushort)(sVar53 < sVar45) * sVar45 | (ushort)(sVar53 >= sVar45) * sVar53;
                auVar102._0_8_ =
                     CONCAT26(uVar106,CONCAT24((ushort)(sVar52 < sVar44) * sVar44 |
                                               (ushort)(sVar52 >= sVar44) * sVar52,
                                               CONCAT22((ushort)(sVar51 < sVar33) * sVar33 |
                                                        (ushort)(sVar51 >= sVar33) * sVar51,
                                                        (ushort)(sVar50 < sVar32) * sVar32 |
                                                        (ushort)(sVar50 >= sVar32) * sVar50)));
                auVar102._8_2_ =
                     (ushort)(sVar54 < sVar46) * sVar46 | (ushort)(sVar54 >= sVar46) * sVar54;
                auVar102._10_2_ =
                     (ushort)(sVar55 < sVar47) * sVar47 | (ushort)(sVar55 >= sVar47) * sVar55;
                auVar102._12_2_ =
                     (ushort)(sVar56 < sVar48) * sVar48 | (ushort)(sVar56 >= sVar48) * sVar56;
                auVar102._14_2_ =
                     (ushort)(sVar57 < sVar49) * sVar49 | (ushort)(sVar57 >= sVar49) * sVar57;
                auVar38 = pblendvb(auVar77,auVar38,auVar105);
                auVar36 = pblendvb(auVar59,auVar36,auVar105);
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
              auVar74._0_8_ = auVar36._0_8_ << 0x10;
              auVar74._8_8_ = auVar36._8_8_ << 0x10 | auVar36._0_8_ >> 0x30;
              auVar78._0_8_ = auVar38._0_8_ << 0x10;
              auVar78._8_8_ = auVar38._8_8_ << 0x10 | auVar38._0_8_ >> 0x30;
              auVar104._0_8_ = auVar70._0_8_ << 0x10;
              auVar104._8_8_ = auVar70._8_8_ << 0x10 | auVar70._0_8_ >> 0x30;
              auVar81._0_8_ = auVar102._0_8_ << 0x10;
              auVar81._8_8_ = auVar102._8_8_ << 0x10 | (ulong)uVar106;
              auVar82 = paddsw(auVar81,ZEXT416(uVar13));
              sVar32 = auVar82._0_2_;
              auVar42._0_2_ = -(ushort)(0 < sVar32);
              sVar33 = auVar82._2_2_;
              auVar42._2_2_ = -(ushort)((short)uVar85 < sVar33);
              sVar44 = auVar82._4_2_;
              auVar42._4_2_ = -(ushort)((short)uVar88 < sVar44);
              sVar45 = auVar82._6_2_;
              auVar42._6_2_ = -(ushort)((short)uVar90 < sVar45);
              sVar46 = auVar82._8_2_;
              auVar42._8_2_ = -(ushort)((short)uVar92 < sVar46);
              sVar47 = auVar82._10_2_;
              auVar42._10_2_ = -(ushort)((short)auVar60._8_2_ < sVar47);
              sVar48 = auVar82._12_2_;
              sVar49 = auVar82._14_2_;
              auVar42._12_2_ = -(ushort)((short)auVar60._10_2_ < sVar48);
              auVar42._14_2_ = -(ushort)((short)auVar60._12_2_ < sVar49);
              auVar38 = pblendvb(local_158,auVar74,auVar42);
              auVar59 = pblendvb(local_168,auVar78,auVar42);
              auVar70 = pblendvb(local_178,auVar104,auVar42);
              auVar61._2_2_ =
                   (ushort)((short)uVar85 < sVar33) * sVar33 | ((short)uVar85 >= sVar33) * uVar85;
              auVar61._0_2_ = (ushort)(0 < sVar32) * sVar32;
              auVar61._4_2_ =
                   (ushort)((short)uVar88 < sVar44) * sVar44 | ((short)uVar88 >= sVar44) * uVar88;
              auVar61._6_2_ =
                   (ushort)((short)uVar90 < sVar45) * sVar45 | ((short)uVar90 >= sVar45) * uVar90;
              auVar61._8_2_ =
                   (ushort)((short)uVar92 < sVar46) * sVar46 | ((short)uVar92 >= sVar46) * uVar92;
              auVar61._10_2_ =
                   (ushort)((short)auVar60._8_2_ < sVar47) * sVar47 |
                   ((short)auVar60._8_2_ >= sVar47) * auVar60._8_2_;
              auVar61._12_2_ =
                   (ushort)((short)auVar60._10_2_ < sVar48) * sVar48 |
                   ((short)auVar60._10_2_ >= sVar48) * auVar60._10_2_;
              auVar61._14_2_ =
                   (ushort)((short)auVar60._12_2_ < sVar49) * sVar49 |
                   ((short)auVar60._12_2_ >= sVar49) * auVar60._12_2_;
              lVar24 = 0;
              auVar12._4_4_ = uVar34;
              auVar12._0_4_ = uVar34;
              auVar12._8_4_ = uVar34;
              auVar12._12_4_ = uVar34;
              lVar19 = local_1d0;
              auVar36 = auVar39;
              do {
                auVar72._4_4_ = uVar35;
                auVar72._0_4_ = uVar35;
                auVar72._8_4_ = uVar35;
                auVar72._12_4_ = uVar35;
                auVar39 = psubsw(auVar61,auVar12);
                auVar76 = psubsw(auVar82,auVar72);
                sVar32 = auVar39._0_2_;
                sVar50 = auVar76._0_2_;
                auVar62._0_2_ = -(ushort)(sVar50 < sVar32);
                sVar33 = auVar39._2_2_;
                sVar51 = auVar76._2_2_;
                auVar62._2_2_ = -(ushort)(sVar51 < sVar33);
                sVar44 = auVar39._4_2_;
                sVar52 = auVar76._4_2_;
                auVar62._4_2_ = -(ushort)(sVar52 < sVar44);
                sVar45 = auVar39._6_2_;
                sVar53 = auVar76._6_2_;
                auVar62._6_2_ = -(ushort)(sVar53 < sVar45);
                sVar46 = auVar39._8_2_;
                sVar54 = auVar76._8_2_;
                auVar62._8_2_ = -(ushort)(sVar54 < sVar46);
                sVar47 = auVar39._10_2_;
                sVar55 = auVar76._10_2_;
                auVar62._10_2_ = -(ushort)(sVar55 < sVar47);
                sVar48 = auVar39._12_2_;
                sVar56 = auVar76._12_2_;
                sVar49 = auVar39._14_2_;
                auVar62._12_2_ = -(ushort)(sVar56 < sVar48);
                sVar57 = auVar76._14_2_;
                auVar62._14_2_ = -(ushort)(sVar57 < sVar49);
                puVar1 = (ushort *)((long)*b_03 + lVar24);
                uVar85 = *puVar1;
                uVar88 = puVar1[1];
                uVar90 = puVar1[2];
                uVar92 = puVar1[3];
                uVar94 = puVar1[4];
                uVar96 = puVar1[5];
                uVar98 = puVar1[6];
                uVar100 = puVar1[7];
                auVar104 = pblendvb(auVar104,auVar70,auVar62);
                auVar82._0_2_ =
                     (ushort)(sVar32 < sVar50) * sVar50 | (ushort)(sVar32 >= sVar50) * sVar32;
                auVar82._2_2_ =
                     (ushort)(sVar33 < sVar51) * sVar51 | (ushort)(sVar33 >= sVar51) * sVar33;
                auVar82._4_2_ =
                     (ushort)(sVar44 < sVar52) * sVar52 | (ushort)(sVar44 >= sVar52) * sVar44;
                auVar82._6_2_ =
                     (ushort)(sVar45 < sVar53) * sVar53 | (ushort)(sVar45 >= sVar53) * sVar45;
                auVar82._8_2_ =
                     (ushort)(sVar46 < sVar54) * sVar54 | (ushort)(sVar46 >= sVar54) * sVar46;
                auVar82._10_2_ =
                     (ushort)(sVar47 < sVar55) * sVar55 | (ushort)(sVar47 >= sVar55) * sVar47;
                auVar82._12_2_ =
                     (ushort)(sVar48 < sVar56) * sVar56 | (ushort)(sVar48 >= sVar56) * sVar48;
                auVar82._14_2_ =
                     (ushort)(sVar49 < sVar57) * sVar57 | (ushort)(sVar49 >= sVar57) * sVar49;
                auVar78 = pblendvb(auVar78,auVar59,auVar62);
                psVar2 = (short *)((long)*b + lVar24);
                sVar32 = *psVar2;
                sVar33 = psVar2[1];
                sVar44 = psVar2[2];
                sVar45 = psVar2[3];
                sVar46 = psVar2[4];
                sVar47 = psVar2[5];
                sVar48 = psVar2[6];
                sVar49 = psVar2[7];
                auVar38 = pblendvb(auVar74,auVar38,auVar62);
                uVar106 = (sVar32 < (short)uVar85) * uVar85 |
                          (ushort)(sVar32 >= (short)uVar85) * sVar32;
                uVar109 = (sVar33 < (short)uVar88) * uVar88 |
                          (ushort)(sVar33 >= (short)uVar88) * sVar33;
                uVar111 = (sVar44 < (short)uVar90) * uVar90 |
                          (ushort)(sVar44 >= (short)uVar90) * sVar44;
                uVar113 = (sVar45 < (short)uVar92) * uVar92 |
                          (ushort)(sVar45 >= (short)uVar92) * sVar45;
                uVar115 = (sVar46 < (short)uVar94) * uVar94 |
                          (ushort)(sVar46 >= (short)uVar94) * sVar46;
                uVar117 = (sVar47 < (short)uVar96) * uVar96 |
                          (ushort)(sVar47 >= (short)uVar96) * sVar47;
                uVar119 = (sVar48 < (short)uVar98) * uVar98 |
                          (ushort)(sVar48 >= (short)uVar98) * sVar48;
                uVar65 = (sVar49 < (short)uVar100) * uVar100 |
                         (ushort)(sVar49 >= (short)uVar100) * sVar49;
                uVar107 = ((short)uVar106 < (short)auVar82._0_2_) * auVar82._0_2_ |
                          ((short)uVar106 >= (short)auVar82._0_2_) * uVar106;
                uVar106 = ((short)uVar109 < (short)auVar82._2_2_) * auVar82._2_2_ |
                          ((short)uVar109 >= (short)auVar82._2_2_) * uVar109;
                uVar109 = ((short)uVar111 < (short)auVar82._4_2_) * auVar82._4_2_ |
                          ((short)uVar111 >= (short)auVar82._4_2_) * uVar111;
                uVar111 = ((short)uVar113 < (short)auVar82._6_2_) * auVar82._6_2_ |
                          ((short)uVar113 >= (short)auVar82._6_2_) * uVar113;
                uVar113 = ((short)uVar115 < (short)auVar82._8_2_) * auVar82._8_2_ |
                          ((short)uVar115 >= (short)auVar82._8_2_) * uVar115;
                uVar115 = ((short)uVar117 < (short)auVar82._10_2_) * auVar82._10_2_ |
                          ((short)uVar117 >= (short)auVar82._10_2_) * uVar117;
                uVar117 = ((short)uVar119 < (short)auVar82._12_2_) * auVar82._12_2_ |
                          ((short)uVar119 >= (short)auVar82._12_2_) * uVar119;
                uVar119 = ((short)uVar65 < (short)auVar82._14_2_) * auVar82._14_2_ |
                          ((short)uVar65 >= (short)auVar82._14_2_) * uVar65;
                auVar39 = pmovsxbw(auVar70,0x101010101010101);
                auVar75._0_2_ = -(ushort)((short)uVar107 < auVar39._0_2_);
                auVar75._2_2_ = -(ushort)((short)uVar106 < auVar39._2_2_);
                auVar75._4_2_ = -(ushort)((short)uVar109 < auVar39._4_2_);
                auVar75._6_2_ = -(ushort)((short)uVar111 < auVar39._6_2_);
                auVar75._8_2_ = -(ushort)((short)uVar113 < auVar39._8_2_);
                auVar75._10_2_ = -(ushort)((short)uVar115 < auVar39._10_2_);
                auVar75._12_2_ = -(ushort)((short)uVar117 < auVar39._12_2_);
                auVar75._14_2_ = -(ushort)((short)uVar119 < auVar39._14_2_);
                uVar107 = (-1 < (short)uVar107) * uVar107;
                uVar106 = (-1 < (short)uVar106) * uVar106;
                auVar61._2_2_ = uVar106;
                auVar61._0_2_ = uVar107;
                uVar109 = (-1 < (short)uVar109) * uVar109;
                auVar61._4_2_ = uVar109;
                uVar111 = (-1 < (short)uVar111) * uVar111;
                auVar61._6_2_ = uVar111;
                uVar113 = (-1 < (short)uVar113) * uVar113;
                auVar61._8_2_ = uVar113;
                uVar115 = (-1 < (short)uVar115) * uVar115;
                auVar61._10_2_ = uVar115;
                uVar117 = (-1 < (short)uVar117) * uVar117;
                auVar61._12_2_ = uVar117;
                uVar119 = (-1 < (short)uVar119) * uVar119;
                auVar61._14_2_ = uVar119;
                auVar68._0_2_ = -(ushort)(uVar85 == uVar107);
                auVar68._2_2_ = -(ushort)(uVar88 == uVar106);
                auVar68._4_2_ = -(ushort)(uVar90 == uVar109);
                auVar68._6_2_ = -(ushort)(uVar92 == uVar111);
                auVar68._8_2_ = -(ushort)(uVar94 == uVar113);
                auVar68._10_2_ = -(ushort)(uVar96 == uVar115);
                auVar68._12_2_ = -(ushort)(uVar98 == uVar117);
                auVar68._14_2_ = -(ushort)(uVar100 == uVar119);
                auVar71._0_2_ = -(ushort)(uVar107 == auVar82._0_2_);
                auVar71._2_2_ = -(ushort)(uVar106 == auVar82._2_2_);
                auVar71._4_2_ = -(ushort)(uVar109 == auVar82._4_2_);
                auVar71._6_2_ = -(ushort)(uVar111 == auVar82._6_2_);
                auVar71._8_2_ = -(ushort)(uVar113 == auVar82._8_2_);
                auVar71._10_2_ = -(ushort)(uVar115 == auVar82._10_2_);
                auVar71._12_2_ = -(ushort)(uVar117 == auVar82._12_2_);
                auVar71._14_2_ = -(ushort)(uVar119 == auVar82._14_2_);
                auVar59 = pblendvb(*(undefined1 (*) [16])((long)*b_00 + lVar24),auVar104,auVar71);
                auVar70 = pblendvb(auVar59,*(undefined1 (*) [16])((long)*b_04 + lVar24),auVar68);
                auVar59 = pblendvb(*(undefined1 (*) [16])((long)*b_01 + lVar24),auVar78,auVar71);
                auVar59 = pblendvb(auVar59,*(undefined1 (*) [16])((long)*b_05 + lVar24),auVar68);
                auVar74 = paddsw(auVar38,auVar39);
                auVar38 = pblendvb(*(undefined1 (*) [16])((long)*b_02 + lVar24),auVar74,auVar71);
                auVar38 = pblendvb(auVar38,*(undefined1 (*) [16])((long)*b_06 + lVar24),auVar68);
                auVar70 = ~auVar75 & auVar70;
                auVar59 = ~auVar75 & auVar59;
                auVar38 = ~auVar75 & auVar38;
                sVar32 = auVar37._0_2_;
                uVar85 = (sVar32 < (short)uVar107) * uVar107 |
                         (ushort)(sVar32 >= (short)uVar107) * sVar32;
                sVar32 = auVar37._2_2_;
                uVar88 = (sVar32 < (short)uVar106) * uVar106 |
                         (ushort)(sVar32 >= (short)uVar106) * sVar32;
                sVar32 = auVar37._4_2_;
                uVar90 = (sVar32 < (short)uVar109) * uVar109 |
                         (ushort)(sVar32 >= (short)uVar109) * sVar32;
                sVar32 = auVar37._6_2_;
                uVar92 = (sVar32 < (short)uVar111) * uVar111 |
                         (ushort)(sVar32 >= (short)uVar111) * sVar32;
                sVar32 = auVar37._8_2_;
                uVar94 = (sVar32 < (short)uVar113) * uVar113 |
                         (ushort)(sVar32 >= (short)uVar113) * sVar32;
                sVar32 = auVar37._10_2_;
                uVar96 = (sVar32 < (short)uVar115) * uVar115 |
                         (ushort)(sVar32 >= (short)uVar115) * sVar32;
                sVar32 = auVar37._12_2_;
                sVar33 = auVar37._14_2_;
                uVar98 = (sVar32 < (short)uVar117) * uVar117 |
                         (ushort)(sVar32 >= (short)uVar117) * sVar32;
                uVar100 = (sVar33 < (short)uVar119) * uVar119 |
                          (ushort)(sVar33 >= (short)uVar119) * sVar33;
                sVar32 = auVar70._0_2_;
                uVar85 = (ushort)((short)uVar85 < sVar32) * sVar32 |
                         ((short)uVar85 >= sVar32) * uVar85;
                sVar44 = auVar70._2_2_;
                uVar88 = (ushort)((short)uVar88 < sVar44) * sVar44 |
                         ((short)uVar88 >= sVar44) * uVar88;
                sVar46 = auVar70._4_2_;
                uVar90 = (ushort)((short)uVar90 < sVar46) * sVar46 |
                         ((short)uVar90 >= sVar46) * uVar90;
                sVar48 = auVar70._6_2_;
                uVar92 = (ushort)((short)uVar92 < sVar48) * sVar48 |
                         ((short)uVar92 >= sVar48) * uVar92;
                sVar50 = auVar70._8_2_;
                uVar94 = (ushort)((short)uVar94 < sVar50) * sVar50 |
                         ((short)uVar94 >= sVar50) * uVar94;
                sVar52 = auVar70._10_2_;
                uVar96 = (ushort)((short)uVar96 < sVar52) * sVar52 |
                         ((short)uVar96 >= sVar52) * uVar96;
                sVar54 = auVar70._12_2_;
                uVar98 = (ushort)((short)uVar98 < sVar54) * sVar54 |
                         ((short)uVar98 >= sVar54) * uVar98;
                sVar56 = auVar70._14_2_;
                uVar100 = (ushort)((short)uVar100 < sVar56) * sVar56 |
                          ((short)uVar100 >= sVar56) * uVar100;
                sVar33 = auVar38._0_2_;
                sVar84 = auVar59._0_2_;
                uVar65 = (ushort)(sVar84 < sVar33) * sVar33 | (ushort)(sVar84 >= sVar33) * sVar84;
                sVar45 = auVar38._2_2_;
                sVar87 = auVar59._2_2_;
                uVar108 = (ushort)(sVar87 < sVar45) * sVar45 | (ushort)(sVar87 >= sVar45) * sVar87;
                sVar47 = auVar38._4_2_;
                sVar89 = auVar59._4_2_;
                uVar110 = (ushort)(sVar89 < sVar47) * sVar47 | (ushort)(sVar89 >= sVar47) * sVar89;
                sVar49 = auVar38._6_2_;
                sVar91 = auVar59._6_2_;
                uVar112 = (ushort)(sVar91 < sVar49) * sVar49 | (ushort)(sVar91 >= sVar49) * sVar91;
                sVar51 = auVar38._8_2_;
                sVar93 = auVar59._8_2_;
                uVar114 = (ushort)(sVar93 < sVar51) * sVar51 | (ushort)(sVar93 >= sVar51) * sVar93;
                sVar53 = auVar38._10_2_;
                sVar95 = auVar59._10_2_;
                uVar116 = (ushort)(sVar95 < sVar53) * sVar53 | (ushort)(sVar95 >= sVar53) * sVar95;
                sVar55 = auVar38._12_2_;
                sVar97 = auVar59._12_2_;
                sVar99 = auVar59._14_2_;
                uVar118 = (ushort)(sVar97 < sVar55) * sVar55 | (ushort)(sVar97 >= sVar55) * sVar97;
                sVar57 = auVar38._14_2_;
                uVar120 = (ushort)(sVar99 < sVar57) * sVar57 | (ushort)(sVar99 >= sVar57) * sVar99;
                auVar37._0_2_ =
                     ((short)uVar65 < (short)uVar85) * uVar85 |
                     ((short)uVar65 >= (short)uVar85) * uVar65;
                auVar37._2_2_ =
                     ((short)uVar108 < (short)uVar88) * uVar88 |
                     ((short)uVar108 >= (short)uVar88) * uVar108;
                auVar37._4_2_ =
                     ((short)uVar110 < (short)uVar90) * uVar90 |
                     ((short)uVar110 >= (short)uVar90) * uVar110;
                auVar37._6_2_ =
                     ((short)uVar112 < (short)uVar92) * uVar92 |
                     ((short)uVar112 >= (short)uVar92) * uVar112;
                auVar37._8_2_ =
                     ((short)uVar114 < (short)uVar94) * uVar94 |
                     ((short)uVar114 >= (short)uVar94) * uVar114;
                auVar37._10_2_ =
                     ((short)uVar116 < (short)uVar96) * uVar96 |
                     ((short)uVar116 >= (short)uVar96) * uVar116;
                auVar37._12_2_ =
                     ((short)uVar118 < (short)uVar98) * uVar98 |
                     ((short)uVar118 >= (short)uVar98) * uVar118;
                auVar37._14_2_ =
                     ((short)uVar120 < (short)uVar100) * uVar100 |
                     ((short)uVar120 >= (short)uVar100) * uVar120;
                *(undefined1 (*) [16])((long)*b_03 + lVar24) = auVar61;
                *(undefined1 (*) [16])((long)*b_04 + lVar24) = auVar70;
                *(undefined1 (*) [16])((long)*b_05 + lVar24) = auVar59;
                *(undefined1 (*) [16])((long)*b_06 + lVar24) = auVar38;
                lVar23 = *((ppVar15->field_4).trace)->trace_del_table;
                *(uint *)(lVar23 + lVar19) = (uint)uVar107;
                lVar23 = lVar23 + lVar19;
                *(uint *)(lVar18 + lVar23) = (uint)uVar106;
                *(uint *)(lVar3 + lVar23) = (uint)uVar109;
                *(uint *)(lVar9 + lVar23) = (uint)uVar111;
                *(uint *)(lVar31 + lVar23) = (uint)uVar113;
                *(uint *)(lVar10 + lVar23) = (uint)uVar115;
                *(uint *)(lVar30 + lVar23) = (uint)uVar117;
                *(uint *)(lVar11 + lVar23) = (uint)uVar119;
                lVar23 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8);
                *(int *)(lVar23 + lVar19) = (int)sVar32;
                lVar23 = lVar23 + lVar19;
                *(int *)(lVar18 + lVar23) = (int)sVar44;
                *(int *)(lVar3 + lVar23) = (int)sVar46;
                *(int *)(lVar9 + lVar23) = (int)sVar48;
                *(int *)(lVar31 + lVar23) = (int)sVar50;
                *(int *)(lVar10 + lVar23) = (int)sVar52;
                *(int *)(lVar30 + lVar23) = (int)sVar54;
                *(int *)(lVar11 + lVar23) = (int)sVar56;
                lVar23 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10);
                *(int *)(lVar23 + lVar19) = (int)sVar84;
                lVar23 = lVar23 + lVar19;
                *(int *)(lVar18 + lVar23) = (int)sVar87;
                *(int *)(lVar3 + lVar23) = (int)sVar89;
                *(int *)(lVar9 + lVar23) = (int)sVar91;
                *(int *)(lVar31 + lVar23) = (int)sVar93;
                *(int *)(lVar10 + lVar23) = (int)sVar95;
                *(int *)(lVar30 + lVar23) = (int)sVar97;
                *(int *)(lVar11 + lVar23) = (int)sVar99;
                lVar23 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
                *(int *)(lVar23 + lVar19) = (int)sVar33;
                lVar23 = lVar23 + lVar19;
                *(int *)(lVar18 + lVar23) = (int)sVar45;
                *(int *)(lVar3 + lVar23) = (int)sVar47;
                *(int *)(lVar9 + lVar23) = (int)sVar49;
                *(int *)(lVar31 + lVar23) = (int)sVar51;
                *(int *)(lVar10 + lVar23) = (int)sVar53;
                *(int *)(lVar30 + lVar23) = (int)sVar55;
                *(int *)(lVar11 + lVar23) = (int)sVar57;
                local_248._0_2_ =
                     ((short)uVar107 < (short)(ushort)local_248) * uVar107 |
                     ((short)uVar107 >= (short)(ushort)local_248) * (ushort)local_248;
                local_248._2_2_ =
                     ((short)uVar106 < (short)local_248._2_2_) * uVar106 |
                     ((short)uVar106 >= (short)local_248._2_2_) * local_248._2_2_;
                local_248._4_2_ =
                     ((short)uVar109 < (short)local_248._4_2_) * uVar109 |
                     ((short)uVar109 >= (short)local_248._4_2_) * local_248._4_2_;
                local_248._6_2_ =
                     ((short)uVar111 < (short)local_248._6_2_) * uVar111 |
                     ((short)uVar111 >= (short)local_248._6_2_) * local_248._6_2_;
                uStack_240._0_2_ =
                     ((short)uVar113 < (short)(ushort)uStack_240) * uVar113 |
                     ((short)uVar113 >= (short)(ushort)uStack_240) * (ushort)uStack_240;
                uStack_240._2_2_ =
                     ((short)uVar115 < (short)uStack_240._2_2_) * uVar115 |
                     ((short)uVar115 >= (short)uStack_240._2_2_) * uStack_240._2_2_;
                uStack_240._4_2_ =
                     ((short)uVar117 < (short)uStack_240._4_2_) * uVar117 |
                     ((short)uVar117 >= (short)uStack_240._4_2_) * uStack_240._4_2_;
                uStack_240._6_2_ =
                     ((short)uVar119 < (short)uStack_240._6_2_) * uVar119 |
                     ((short)uVar119 >= (short)uStack_240._6_2_) * uStack_240._6_2_;
                sVar32 = auVar36._0_2_;
                auVar39._0_2_ =
                     (sVar32 < (short)uVar107) * uVar107 |
                     (ushort)(sVar32 >= (short)uVar107) * sVar32;
                sVar32 = auVar36._2_2_;
                auVar39._2_2_ =
                     (sVar32 < (short)uVar106) * uVar106 |
                     (ushort)(sVar32 >= (short)uVar106) * sVar32;
                sVar32 = auVar36._4_2_;
                auVar39._4_2_ =
                     (sVar32 < (short)uVar109) * uVar109 |
                     (ushort)(sVar32 >= (short)uVar109) * sVar32;
                sVar32 = auVar36._6_2_;
                auVar39._6_2_ =
                     (sVar32 < (short)uVar111) * uVar111 |
                     (ushort)(sVar32 >= (short)uVar111) * sVar32;
                sVar32 = auVar36._8_2_;
                auVar39._8_2_ =
                     (sVar32 < (short)uVar113) * uVar113 |
                     (ushort)(sVar32 >= (short)uVar113) * sVar32;
                sVar32 = auVar36._10_2_;
                auVar39._10_2_ =
                     (sVar32 < (short)uVar115) * uVar115 |
                     (ushort)(sVar32 >= (short)uVar115) * sVar32;
                sVar32 = auVar36._12_2_;
                sVar33 = auVar36._14_2_;
                auVar39._12_2_ =
                     (sVar32 < (short)uVar117) * uVar117 |
                     (ushort)(sVar32 >= (short)uVar117) * sVar32;
                auVar39._14_2_ =
                     (sVar33 < (short)uVar119) * uVar119 |
                     (ushort)(sVar33 >= (short)uVar119) * sVar33;
                lVar24 = lVar24 + 0x10;
                lVar19 = lVar19 + (ulong)(uint)s2Len * 4;
                auVar36 = auVar39;
              } while (lVar29 != lVar24);
              auVar43._0_2_ = -(ushort)((short)local_98._0_2_ < (short)auVar39._0_2_);
              auVar43._2_2_ = -(ushort)((short)local_98._2_2_ < (short)auVar39._2_2_);
              auVar43._4_2_ = -(ushort)((short)local_98._4_2_ < (short)auVar39._4_2_);
              auVar43._6_2_ = -(ushort)((short)local_98._6_2_ < (short)auVar39._6_2_);
              auVar43._8_2_ = -(ushort)((short)local_98._8_2_ < (short)auVar39._8_2_);
              auVar43._10_2_ = -(ushort)((short)local_98._10_2_ < (short)auVar39._10_2_);
              auVar43._12_2_ = -(ushort)((short)local_98._12_2_ < (short)auVar39._12_2_);
              auVar43._14_2_ = -(ushort)((short)local_98._14_2_ < (short)auVar39._14_2_);
              if ((((((((((((((((auVar43 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar43 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar43 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar43 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar43 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar43 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar43 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar43 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar43 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar43 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar43 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar43._14_2_ >> 7 & 1) != 0) || (auVar43._14_2_ & 0x8000) != 0) {
                uVar106 = ((short)auVar39._8_2_ < (short)auVar39._0_2_) * auVar39._0_2_ |
                          ((short)auVar39._8_2_ >= (short)auVar39._0_2_) * auVar39._8_2_;
                uVar107 = ((short)auVar39._10_2_ < (short)auVar39._2_2_) * auVar39._2_2_ |
                          ((short)auVar39._10_2_ >= (short)auVar39._2_2_) * auVar39._10_2_;
                uVar109 = ((short)auVar39._12_2_ < (short)auVar39._4_2_) * auVar39._4_2_ |
                          ((short)auVar39._12_2_ >= (short)auVar39._4_2_) * auVar39._12_2_;
                uVar111 = ((short)auVar39._14_2_ < (short)auVar39._6_2_) * auVar39._6_2_ |
                          ((short)auVar39._14_2_ >= (short)auVar39._6_2_) * auVar39._14_2_;
                sVar44 = (0 < (short)auVar39._8_2_) * auVar39._8_2_;
                sVar33 = (0 < (short)auVar39._10_2_) * auVar39._10_2_;
                sVar32 = (0 < (short)auVar39._12_2_) * auVar39._12_2_;
                sVar45 = (0 < (short)auVar39._14_2_) * auVar39._14_2_;
                auVar63._0_8_ =
                     CONCAT26((sVar33 < (short)uVar111) * uVar111 |
                              (ushort)(sVar33 >= (short)uVar111) * sVar33,
                              CONCAT24((sVar44 < (short)uVar109) * uVar109 |
                                       (ushort)(sVar44 >= (short)uVar109) * sVar44,
                                       CONCAT22(((short)uVar111 < (short)uVar107) * uVar107 |
                                                ((short)uVar111 >= (short)uVar107) * uVar111,
                                                ((short)uVar109 < (short)uVar106) * uVar106 |
                                                ((short)uVar109 >= (short)uVar106) * uVar109)));
                auVar63._8_2_ =
                     (ushort)(sVar32 < sVar44) * sVar44 | (ushort)(sVar32 >= sVar44) * sVar32;
                auVar63._10_2_ =
                     (ushort)(sVar45 < sVar33) * sVar33 | (ushort)(sVar45 >= sVar33) * sVar45;
                auVar63._12_2_ = (ushort)(0 < sVar32) * sVar32;
                auVar63._14_2_ = (ushort)(0 < sVar45) * sVar45;
                auVar36 = phminposuw(auVar39 ^ _DAT_008d1290);
                local_2bc = auVar36._0_4_ ^ 0x7fff;
                auVar36 = pshuflw(auVar36,auVar63,0);
                auVar64._0_8_ = auVar63._0_8_ >> 0x10;
                auVar64._8_8_ = auVar63._8_8_ >> 0x10;
                auVar59 = pshuflw(auVar64,auVar64,0);
                sVar32 = auVar36._0_2_;
                sVar44 = auVar59._0_2_;
                sVar33 = auVar36._2_2_;
                sVar45 = auVar59._2_2_;
                local_98._4_4_ =
                     CONCAT22((ushort)(sVar45 < sVar33) * sVar33 |
                              (ushort)(sVar45 >= sVar33) * sVar45,
                              (ushort)(sVar44 < sVar32) * sVar32 |
                              (ushort)(sVar44 >= sVar32) * sVar44);
                local_98._0_4_ = local_98._4_4_;
                local_98._8_4_ = local_98._4_4_;
                local_98._12_4_ = local_98._4_4_;
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                memcpy(__dest_02,b_06,__n);
                local_274 = (int)uVar28;
              }
              uVar28 = uVar28 + 1;
              local_1d0 = local_1d0 + 4;
            } while (uVar28 != uVar16);
            sVar32 = (short)local_2bc;
            if ((uVar25 & 0x7ffffff8) == 0) {
              sVar33 = 0;
              sVar44 = 0;
              sVar45 = 0;
            }
            else {
              uVar25 = 0;
              sVar45 = 0;
              sVar44 = 0;
              sVar33 = 0;
              do {
                if ((*(short *)((long)*__dest + uVar25 * 2) == sVar32) &&
                   (uVar26 = ((uint)uVar25 & 7) * uVar27 + ((uint)(uVar25 >> 3) & 0x1fffffff),
                   (int)uVar26 < (int)uVar21)) {
                  sVar33 = *(short *)((long)*__dest_00 + uVar25 * 2);
                  sVar44 = *(short *)((long)*__dest_01 + uVar25 * 2);
                  sVar45 = *(short *)((long)*__dest_02 + uVar25 * 2);
                  uVar21 = (ulong)uVar26;
                }
                uVar26 = (uint)uVar21;
                uVar25 = uVar25 + 1;
              } while ((uVar27 & 0xfffffff) << 3 != (int)uVar25);
            }
            auVar58._0_2_ = -(ushort)((short)(ushort)local_248 < (short)local_1c8);
            auVar58._2_2_ = -(ushort)((short)local_248._2_2_ < (short)uStack_1c6);
            auVar58._4_2_ = -(ushort)((short)local_248._4_2_ < (short)local_1c8);
            auVar58._6_2_ = -(ushort)((short)local_248._6_2_ < (short)uStack_1c6);
            auVar58._8_2_ = -(ushort)((short)(ushort)uStack_240 < (short)local_1c8);
            auVar58._10_2_ = -(ushort)((short)uStack_240._2_2_ < (short)uStack_1c6);
            auVar58._12_2_ = -(ushort)((short)uStack_240._4_2_ < (short)local_1c8);
            auVar58._14_2_ = -(ushort)((short)uStack_240._6_2_ < (short)uStack_1c6);
            auVar66._0_2_ = -(ushort)(local_a8 < (short)auVar37._0_2_);
            auVar66._2_2_ = -(ushort)(sStack_a6 < (short)auVar37._2_2_);
            auVar66._4_2_ = -(ushort)(local_a8 < (short)auVar37._4_2_);
            auVar66._6_2_ = -(ushort)(sStack_a6 < (short)auVar37._6_2_);
            auVar66._8_2_ = -(ushort)(local_a8 < (short)auVar37._8_2_);
            auVar66._10_2_ = -(ushort)(sStack_a6 < (short)auVar37._10_2_);
            auVar66._12_2_ = -(ushort)(local_a8 < (short)auVar37._12_2_);
            auVar66._14_2_ = -(ushort)(sStack_a6 < (short)auVar37._14_2_);
            auVar66 = auVar66 | auVar58;
            if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar66 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar66 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar66 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar66 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar66 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar66 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar66 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar66 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar66 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar66 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar66[0xf] < '\0') {
              *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
              sVar32 = 0;
              sVar33 = 0;
              sVar44 = 0;
              sVar45 = 0;
              local_274 = 0;
              uVar26 = 0;
            }
            ppVar15->score = (int)sVar32;
            ppVar15->end_query = uVar26;
            ppVar15->end_ref = local_274;
            *(int *)(ppVar15->field_4).extra = (int)sVar33;
            ((ppVar15->field_4).stats)->similar = (int)sVar44;
            ((ppVar15->field_4).stats)->length = (int)sVar45;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(b_01);
            parasail_free(b_00);
            parasail_free(b);
            return ppVar15;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int16_t score = 0;
    int16_t matches = 0;
    int16_t similar = 0;
    int16_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m128i*)profile->profile16.score;
    pvPm = (__m128i*)profile->profile16.matches;
    pvPs = (__m128i*)profile->profile16.similar;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi16(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm_slli_si128(_mm_set1_epi16(segLen), 2);
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            vGapperL = _mm_adds_epi16(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i case0;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHpM = _mm_slli_si128(vHpM, 2);
        vHpS = _mm_slli_si128(vHpS, 2);
        vHpL = _mm_slli_si128(vHpL, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_subs_epi16(vH, vGapO);
            vE_ext = _mm_subs_epi16(vE, vGapE);
            case1 = _mm_cmpgt_epi16(vE_opn, vE_ext);
            vE = _mm_max_epi16(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_adds_epi16(vEL, vOne);
            vGapper = _mm_adds_epi16(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vF, vGapper),
                    _mm_cmpeq_epi16(vF, vGapper));
            vF = _mm_max_epi16(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_adds_epi16(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_adds_epi16(vHp, vW);
            vHpM = _mm_adds_epi16(vHpM, vWM);
            vHpS = _mm_adds_epi16(vHpS, vWS);
            vHpL = _mm_adds_epi16(vHpL, vOne);
            case1 = _mm_cmpgt_epi16(vE, vHp);
            vHt = _mm_max_epi16(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHtM = _mm_slli_si128(vHtM, 2);
        vHtS = _mm_slli_si128(vHtS, 2);
        vHtL = _mm_slli_si128(vHtL, 2);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_adds_epi16(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi16(vGapper, vF),
                _mm_cmpeq_epi16(vGapper, vF));
        vF = _mm_max_epi16(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_adds_epi16(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            __m128i vFtM = _mm_slli_si128(vFM, 2);
            __m128i vFtS = _mm_slli_si128(vFS, 2);
            __m128i vFtL = _mm_slli_si128(vFL, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi16(vFt, vF),
                    _mm_cmpeq_epi16(vFt, vF));
            vF = _mm_max_epi16(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_adds_epi16(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vFM = _mm_slli_si128(vFM, 2);
        vFS = _mm_slli_si128(vFS, 2);
        vFL = _mm_slli_si128(vFL, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi16(vF, vHt);
        vH = _mm_max_epi16(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_subs_epi16(vH, vGapO);
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi16(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_adds_epi16(vFL, vOne);
            vH = _mm_max_epi16(vHp, vE);
            vH = _mm_max_epi16(vH, vF);
            vH = _mm_max_epi16(vH, vZero);
            case1 = _mm_cmpeq_epi16(vH, vHp);
            case2 = _mm_cmpeq_epi16(vH, vF);
            case0 = _mm_cmpeq_epi16(vH, vZero);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm_blendv_epi8(vHM, vZero, case0);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm_blendv_epi8(vHS, vZero, case0);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm_blendv_epi8(vHL, vZero, case0);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m128i cond_max = _mm_cmpgt_epi16(vH, vMaxH);
                vMaxH = _mm_max_epi16(vH, vMaxH);
                vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m128i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m128i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            __m128i vHM = _mm_load_si128(pvHM + offset);
            __m128i vHS = _mm_load_si128(pvHS + offset);
            __m128i vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
                vHM = _mm_slli_si128(vHM, 2);
                vHS = _mm_slli_si128(vHS, 2);
                vHL = _mm_slli_si128(vHL, 2);
            }
            result->stats->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
            result->stats->rowcols->matches_row[j] = (int16_t) _mm_extract_epi16 (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int16_t) _mm_extract_epi16 (vHS, 7);
            result->stats->rowcols->length_row[j] = (int16_t) _mm_extract_epi16 (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int16_t *m = (int16_t*)pvHMMax;
        int16_t *s = (int16_t*)pvHSMax;
        int16_t *l = (int16_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}